

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream_reader.cpp
# Opt level: O0

bool __thiscall argo::stream_reader::read_next_block(stream_reader *this)

{
  long lVar1;
  ulong uVar2;
  json_io_exception *this_00;
  int *piVar3;
  streamsize n;
  stream_reader *this_local;
  
  std::istream::read((char *)this->m_stream,(long)(this->super_reader).m_block);
  lVar1 = std::istream::gcount();
  if (lVar1 < 1) {
    uVar2 = std::ios::eof();
    if ((uVar2 & 1) == 0) {
      this_00 = (json_io_exception *)__cxa_allocate_exception(0xd8);
      piVar3 = __errno_location();
      json_io_exception::json_io_exception(this_00,read_failed_e,*piVar3);
      __cxa_throw(this_00,&json_io_exception::typeinfo,json_io_exception::~json_io_exception);
    }
    this_local._7_1_ = false;
  }
  else {
    (this->super_reader).m_block_num_bytes = (int)lVar1;
    (this->super_reader).m_block_index = 0;
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool stream_reader::read_next_block()
{
    m_stream->read(reinterpret_cast<char *>(m_block), block_size);

    streamsize n = m_stream->gcount();

    if (n > 0)
    {
        m_block_num_bytes = static_cast<int>(n);
        m_block_index = 0;
        return true;
    }
    else
    {
        if (m_stream->eof())
        {
            return false;
        }
        else
        {
            throw json_io_exception(json_io_exception::read_failed_e, errno);
        }
    }
}